

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O1

void CreateBackwardReferencesNH5
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals,BackwardReferenceFromDecoder *backward_references,
               size_t *back_refs_position,size_t back_refs_size)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint uVar6;
  uint32_t uVar7;
  long lVar8;
  BrotliDictionary *pBVar9;
  bool bVar10;
  ushort uVar11;
  size_t sVar12;
  bool bVar13;
  int iVar14;
  ulong uVar15;
  size_t *psVar16;
  undefined8 uVar17;
  void *pvVar18;
  byte bVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  int iVar28;
  long lVar29;
  uint8_t *puVar30;
  ulong uVar31;
  int *piVar32;
  ushort uVar33;
  size_t *psVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  size_t *psVar38;
  long lVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  uint uVar46;
  uint uVar47;
  ulong uVar48;
  ulong uVar49;
  int last_distance;
  int iVar50;
  uint8_t *puVar51;
  long lVar52;
  ulong uVar53;
  size_t sVar54;
  long lVar55;
  ulong uVar56;
  bool bVar57;
  ulong local_158;
  ulong local_150;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_f8;
  ulong local_e0;
  ulong local_d8;
  size_t *local_b8;
  
  bVar19 = literal_context_lut[8];
  lVar8 = *(long *)(literal_context_lut + 0x10);
  local_f8 = *(ulong *)dist_cache;
  uVar1 = position + num_bytes;
  uVar15 = (position - 3) + num_bytes;
  if (num_bytes < 4) {
    uVar15 = position;
  }
  lVar20 = 0x200;
  if (*(int *)(literal_context_lut + 4) < 9) {
    lVar20 = 0x40;
  }
  uVar4 = (params->dist).alphabet_size_limit;
  if (4 < (int)uVar4) {
    iVar28 = *(int *)&(hasher->common).extra;
    *(int *)&(hasher->common).dict_num_matches = iVar28 + -1;
    *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar28 + 1;
    (hasher->common).params.type = iVar28 + -2;
    (hasher->common).params.bucket_bits = iVar28 + 2;
    (hasher->common).params.block_bits = iVar28 + -3;
    (hasher->common).params.hash_len = iVar28 + 3;
    if (10 < (int)uVar4) {
      iVar28 = *(int *)((long)&(hasher->common).extra + 4);
      (hasher->common).params.num_last_distances_to_check = iVar28 + -1;
      (hasher->common).is_prepared_ = iVar28 + 1;
      *(int *)&hasher->privat = iVar28 + -2;
      *(int *)((long)&hasher->privat + 4) = iVar28 + 2;
      *(int *)((long)&hasher->privat + 8) = iVar28 + -3;
      *(int *)((long)&hasher->privat + 0xc) = iVar28 + 3;
    }
  }
  if (position + 4 < uVar1) {
    uVar3 = (1L << (bVar19 & 0x3f)) - 0x10;
    local_d8 = lVar20 + position;
    lVar2 = position - 1;
    local_b8 = last_insert_len;
    do {
      uVar37 = uVar3;
      if (position < uVar3) {
        uVar37 = position;
      }
      uVar36 = lVar8 + position;
      if (uVar3 <= lVar8 + position) {
        uVar36 = uVar3;
      }
      uVar35 = *(ulong *)(literal_context_lut + 0x50);
      pBVar9 = (params->dictionary).words;
      lVar39 = *(long *)&(params->dictionary).num_transforms;
      psVar38 = *(size_t **)backward_references;
      bVar57 = psVar38 < back_refs_position;
      if ((bVar57) && ((ulong)(long)(int)num_literals[(long)psVar38 * 2] < position)) {
        psVar16 = num_literals + (long)psVar38 * 2 + 2;
        psVar34 = psVar38;
        do {
          psVar34 = (size_t *)((long)psVar34 + 1);
          psVar38 = back_refs_position;
          if (back_refs_position == psVar34) break;
          sVar12 = *psVar16;
          psVar16 = psVar16 + 2;
          psVar38 = psVar34;
        } while ((ulong)(long)(int)sVar12 < position);
        *(size_t **)backward_references = psVar34;
        bVar57 = psVar34 < back_refs_position;
      }
      local_158 = uVar1 - position;
      uVar48 = position & ringbuffer_mask;
      if ((bVar57) && (position == (long)(int)num_literals[(long)psVar38 * 2])) {
        uVar27 = (uint)num_literals[(long)psVar38 * 2 + 1];
        local_118 = (ulong)(int)uVar27;
        local_110 = 0x7e4;
        iVar28 = 0;
        bVar10 = true;
        if ((position - local_118 < position) &&
           (uVar27 <= *(uint *)((long)num_literals + (long)psVar38 * 0x10 + 0xc))) {
          uVar21 = position - local_118 & ringbuffer_mask;
          if (7 < local_158) {
            uVar25 = local_158 & 0xfffffffffffffff8;
            puVar30 = ringbuffer + uVar25 + uVar48;
            lVar39 = 0;
            uVar22 = 0;
LAB_00104abe:
            uVar53 = *(ulong *)(ringbuffer + uVar48 + uVar22 * 8);
            if (uVar53 == *(ulong *)(ringbuffer + uVar22 * 8 + uVar21)) goto code_r0x00104acb;
            uVar53 = *(ulong *)(ringbuffer + uVar22 * 8 + uVar21) ^ uVar53;
            uVar21 = 0;
            if (uVar53 != 0) {
              for (; (uVar53 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
              }
            }
            uVar22 = (uVar21 >> 3 & 0x1fffffff) - lVar39;
            goto LAB_00104af6;
          }
          uVar25 = 0;
          puVar30 = ringbuffer + uVar48;
LAB_00105c88:
          uVar53 = local_158 & 7;
          uVar22 = uVar25;
          if (uVar53 != 0) {
            uVar31 = uVar25 | uVar53;
            do {
              uVar22 = uVar25;
              if (ringbuffer[uVar25 + uVar21] != *puVar30) break;
              puVar30 = puVar30 + 1;
              uVar25 = uVar25 + 1;
              uVar53 = uVar53 - 1;
              uVar22 = uVar31;
            } while (uVar53 != 0);
          }
LAB_00104af6:
          uVar21 = (ulong)*(int *)((long)num_literals + (long)psVar38 * 0x10 + 4);
          if (uVar22 < uVar21) {
            uVar21 = uVar22;
          }
          iVar26 = 0x1f;
          if (uVar27 != 0) {
            for (; uVar27 >> iVar26 == 0; iVar26 = iVar26 + -1) {
            }
          }
          local_110 = (ulong)(iVar26 * -0x1e + 0x780) + uVar21 * 0x87;
          bVar13 = true;
          bVar10 = false;
        }
        else {
          bVar13 = false;
          local_118 = 0;
          uVar21 = 0;
        }
        local_150 = uVar21;
        if (bVar10) goto LAB_0010470a;
      }
      else {
        uVar21 = (ulong)(int)(params->dist).alphabet_size_limit;
        if (uVar21 == 0) {
          local_110 = 0x7e4;
          local_118 = 0;
          local_150 = 0;
          uVar25 = 0;
        }
        else {
          puVar30 = ringbuffer + uVar48;
          uVar53 = (ulong)((uint)local_158 & 7);
          local_110 = 0x7e4;
          uVar25 = 0;
          uVar22 = 0;
          local_150 = 0;
          local_118 = 0;
          do {
            uVar31 = (ulong)*(int *)((long)&(hasher->common).extra + uVar22 * 4);
            if (((uVar31 <= uVar37) && (position - uVar31 < position)) &&
               (uVar25 + uVar48 <= ringbuffer_mask)) {
              uVar44 = position - uVar31 & ringbuffer_mask;
              if ((uVar44 + uVar25 <= ringbuffer_mask) &&
                 (ringbuffer[uVar25 + uVar48] == ringbuffer[uVar44 + uVar25])) {
                if (7 < local_158) {
                  lVar42 = 0;
                  uVar56 = 0;
LAB_00104364:
                  if (*(ulong *)(puVar30 + uVar56 * 8) ==
                      *(ulong *)(ringbuffer + uVar56 * 8 + uVar44)) goto code_r0x00104379;
                  uVar56 = *(ulong *)(ringbuffer + uVar56 * 8 + uVar44) ^
                           *(ulong *)(puVar30 + uVar56 * 8);
                  uVar44 = 0;
                  if (uVar56 != 0) {
                    for (; (uVar56 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  uVar56 = (uVar44 >> 3 & 0x1fffffff) - lVar42;
                  goto LAB_001043c7;
                }
                uVar49 = 0;
                puVar51 = puVar30;
LAB_00104466:
                uVar56 = uVar49;
                if (uVar53 != 0) {
                  uVar23 = uVar53 | uVar49;
                  uVar40 = uVar53;
                  do {
                    uVar56 = uVar49;
                    if (ringbuffer[uVar49 + uVar44] != *puVar51) break;
                    puVar51 = puVar51 + 1;
                    uVar49 = uVar49 + 1;
                    uVar40 = uVar40 - 1;
                    uVar56 = uVar23;
                  } while (uVar40 != 0);
                }
LAB_001043c7:
                if ((bVar57) &&
                   ((ulong)(long)(int)num_literals[(long)psVar38 * 2] < uVar56 + position)) {
                  uVar56 = (long)(int)num_literals[(long)psVar38 * 2] - position;
                }
                if (((2 < uVar56) || ((uVar22 < 2 && (uVar56 == 2)))) &&
                   (uVar44 = uVar56 * 0x87 + 0x78f, local_110 < uVar44)) {
                  if (uVar22 != 0) {
                    uVar44 = uVar44 - ((0x1ca10U >> ((byte)uVar22 & 0xe) & 0xe) + 0x27);
                  }
                  if (local_110 < uVar44) {
                    uVar25 = uVar56;
                    local_150 = uVar56;
                    local_118 = uVar31;
                    local_110 = uVar44;
                  }
                }
              }
            }
            uVar22 = uVar22 + 1;
          } while (uVar22 != uVar21);
        }
        uVar27 = (uint)(*(int *)(ringbuffer + uVar48) * 0x1e35a7bd) >>
                 ((byte)(params->dist).distance_postfix_bits & 0x1f);
        uVar33 = *(ushort *)(pBVar9->size_bits_by_length + (ulong)uVar27 * 2);
        uVar22 = (ulong)uVar33;
        piVar32 = &(params->hasher).num_last_distances_to_check;
        puVar30 = ringbuffer + uVar48;
        uVar21 = 0;
        if (*(ulong *)piVar32 <= uVar22) {
          uVar21 = uVar22 - *(long *)piVar32;
        }
        lVar39 = lVar39 + (ulong)(uVar27 << ((byte)(params->dist).alphabet_size_max & 0x1f)) * 4;
        uVar53 = (ulong)((uint)local_158 & 7);
        do {
          if (uVar22 <= uVar21) break;
          uVar22 = uVar22 - 1;
          uVar46 = *(uint *)(lVar39 + (ulong)((params->dist).num_direct_distance_codes &
                                             (uint)uVar22) * 4);
          uVar31 = position - uVar46;
          if ((uVar31 <= uVar37) && (uVar25 + uVar48 <= ringbuffer_mask)) {
            uVar44 = (ulong)(uVar46 & (uint)ringbuffer_mask);
            if ((uVar44 + uVar25 <= ringbuffer_mask) &&
               (ringbuffer[uVar25 + uVar48] == ringbuffer[uVar44 + uVar25])) {
              if (7 < local_158) {
                lVar42 = 0;
                uVar56 = 0;
LAB_001045c9:
                if (*(ulong *)(puVar30 + uVar56 * 8) == *(ulong *)(ringbuffer + uVar56 * 8 + uVar44)
                   ) goto code_r0x001045db;
                uVar56 = *(ulong *)(ringbuffer + uVar56 * 8 + uVar44) ^
                         *(ulong *)(puVar30 + uVar56 * 8);
                uVar44 = 0;
                if (uVar56 != 0) {
                  for (; (uVar56 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                  }
                }
                uVar56 = (uVar44 >> 3 & 0x1fffffff) - lVar42;
                goto LAB_00104616;
              }
              puVar51 = puVar30;
              uVar49 = 0;
LAB_0010469a:
              uVar56 = uVar49;
              if (uVar53 != 0) {
                uVar23 = uVar53 | uVar49;
                uVar40 = uVar53;
                do {
                  uVar56 = uVar49;
                  if (ringbuffer[uVar49 + uVar44] != *puVar51) break;
                  puVar51 = puVar51 + 1;
                  uVar49 = uVar49 + 1;
                  uVar40 = uVar40 - 1;
                  uVar56 = uVar23;
                } while (uVar40 != 0);
              }
LAB_00104616:
              if ((bVar57) &&
                 ((ulong)(long)(int)num_literals[(long)psVar38 * 2] < uVar56 + position)) {
                uVar56 = (long)(int)num_literals[(long)psVar38 * 2] - position;
              }
              if (3 < uVar56) {
                iVar28 = 0x1f;
                if ((uint)uVar31 != 0) {
                  for (; (uint)uVar31 >> iVar28 == 0; iVar28 = iVar28 + -1) {
                  }
                }
                uVar44 = (ulong)(iVar28 * -0x1e + 0x780) + uVar56 * 0x87;
                if (local_110 < uVar44) {
                  uVar25 = uVar56;
                  local_150 = uVar56;
                  local_118 = uVar31;
                  local_110 = uVar44;
                }
              }
            }
          }
        } while (uVar31 <= uVar37);
        *(int *)(lVar39 + (ulong)((params->dist).num_direct_distance_codes & (uint)uVar33) * 4) =
             (int)position;
        *(ushort *)(pBVar9->size_bits_by_length + (ulong)uVar27 * 2) = uVar33 + 1;
        bVar13 = false;
LAB_0010470a:
        iVar28 = 0;
        uVar21 = local_150;
        if (local_110 == 0x7e4) {
          if (back_refs_position == (size_t *)0x0) {
            sVar12 = (params->dist).max_distance;
            if (*(ulong *)(sVar12 + 8) >> 7 <= *(ulong *)(sVar12 + 0x10)) {
              piVar32 = (int *)(ringbuffer + uVar48);
              uVar37 = (ulong)((uint)(*piVar32 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
              lVar39 = *(long *)(literal_context_lut + 0x78);
              lVar42 = *(long *)(sVar12 + 8);
              iVar28 = 0;
              lVar41 = 0;
LAB_001048b2:
              lVar42 = lVar42 + 1;
              *(long *)(sVar12 + 8) = lVar42;
              bVar19 = *(byte *)(lVar39 + uVar37);
              uVar48 = (ulong)bVar19;
              if (uVar48 != 0) {
                bVar57 = true;
                if (uVar48 <= local_158) {
                  uVar21 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar37 * 2);
                  lVar29 = *(long *)(literal_context_lut + 0x58);
                  pcVar24 = (char *)(uVar21 * uVar48 + *(long *)(lVar29 + 0xa8) +
                                    (ulong)*(uint *)(lVar29 + 0x20 + uVar48 * 4));
                  if (7 < bVar19) {
                    uVar22 = (ulong)(bVar19 & 0xfffffff8);
                    lVar52 = 0;
                    uVar25 = 0;
LAB_0010491e:
                    if (*(ulong *)(pcVar24 + uVar25 * 8) == *(ulong *)(piVar32 + uVar25 * 2))
                    goto code_r0x0010492b;
                    uVar22 = *(ulong *)(piVar32 + uVar25 * 2) ^ *(ulong *)(pcVar24 + uVar25 * 8);
                    uVar25 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                      }
                    }
                    uVar25 = (uVar25 >> 3 & 0x1fffffff) - lVar52;
                    goto LAB_00104969;
                  }
                  uVar22 = 0;
                  goto LAB_00104a39;
                }
                goto LAB_001049c2;
              }
              goto LAB_001049d0;
            }
          }
          else if ((bVar57) && (position == (long)(int)num_literals[(long)psVar38 * 2])) {
            uVar27 = (uint)num_literals[(long)psVar38 * 2 + 1];
            if (*(int *)((long)num_literals + (long)psVar38 * 0x10 + 0xc) < (int)uVar27) {
              uVar46 = *(uint *)((long)num_literals + (long)psVar38 * 0x10 + 4);
              uVar36 = (ulong)uVar46;
              if (uVar46 - 4 < 0x15 && (int)uVar27 < 0x7ffffffd) {
                uVar47 = ~(uint)uVar37 + uVar27;
                lVar39 = *(long *)(literal_context_lut + 0x58);
                iVar26 = (int)uVar47 >> (*(byte *)(lVar39 + uVar36) & 0x1f);
                if (iVar26 < *(int *)(literal_context_lut + 0x60)) {
                  uVar5 = *(uint *)(lVar39 + 0x20 + uVar36 * 4);
                  uVar6 = kBitMask[*(byte *)(lVar39 + uVar36)];
                  lVar39 = *(long *)(lVar39 + 0xa8);
                  uVar17 = BrotliGetTransforms();
                  pvVar18 = malloc(uVar36 * 10);
                  iVar26 = BrotliTransformDictionaryWord
                                     (pvVar18,(ulong)uVar5 + lVar39 +
                                              (long)(int)((uVar47 & uVar6) * uVar46),uVar46,uVar17,
                                      iVar26);
                  sVar54 = (size_t)iVar26;
                  iVar14 = bcmp(ringbuffer + uVar48,pvVar18,sVar54);
                  if (iVar14 == 0) {
                    iVar28 = 0x1f;
                    if (uVar27 != 0) {
                      for (; uVar27 >> iVar28 == 0; iVar28 = iVar28 + -1) {
                      }
                    }
                    local_110 = (ulong)(iVar28 * -0x1e + 0x780) + sVar54 * 0x87;
                    iVar28 = uVar46 - iVar26;
                    local_118 = (long)(int)uVar27;
                    local_150 = sVar54;
                  }
                }
              }
              bVar13 = true;
              uVar21 = local_150;
            }
          }
        }
      }
LAB_00104b4a:
      if (local_110 < 0x7e5) {
        local_f8 = local_f8 + 1;
        uVar37 = position + 1;
        if ((back_refs_position == (size_t *)0x0) && (local_d8 < uVar37)) {
          if ((uint)((int)lVar20 * 4) + local_d8 < uVar37) {
            uVar36 = position + 0x11;
            if (uVar1 - 4 <= position + 0x11) {
              uVar36 = uVar1 - 4;
            }
            if (uVar37 < uVar36) {
              uVar4 = (params->dist).distance_postfix_bits;
              uVar27 = (params->dist).num_direct_distance_codes;
              pBVar9 = (params->dictionary).words;
              uVar7 = (params->dist).alphabet_size_max;
              lVar39 = *(long *)&(params->dictionary).num_transforms;
              do {
                uVar46 = (uint)(*(int *)(ringbuffer + (uVar37 & ringbuffer_mask)) * 0x1e35a7bd) >>
                         ((byte)uVar4 & 0x1f);
                uVar33 = *(ushort *)(pBVar9->size_bits_by_length + (ulong)uVar46 * 2);
                *(int *)(lVar39 + (ulong)(uVar27 & uVar33) * 4 +
                        (ulong)(uVar46 << ((byte)uVar7 & 0x1f)) * 4) = (int)uVar37;
                *(ushort *)(pBVar9->size_bits_by_length + (ulong)uVar46 * 2) = uVar33 + 1;
                local_f8 = local_f8 + 4;
                uVar37 = uVar37 + 4;
              } while (uVar37 < uVar36);
            }
          }
          else {
            uVar36 = position + 9;
            if (uVar1 - 3 <= position + 9) {
              uVar36 = uVar1 - 3;
            }
            if (uVar37 < uVar36) {
              uVar4 = (params->dist).distance_postfix_bits;
              uVar27 = (params->dist).num_direct_distance_codes;
              pBVar9 = (params->dictionary).words;
              uVar7 = (params->dist).alphabet_size_max;
              lVar39 = *(long *)&(params->dictionary).num_transforms;
              do {
                uVar46 = (uint)(*(int *)(ringbuffer + (uVar37 & ringbuffer_mask)) * 0x1e35a7bd) >>
                         ((byte)uVar4 & 0x1f);
                uVar33 = *(ushort *)(pBVar9->size_bits_by_length + (ulong)uVar46 * 2);
                *(int *)(lVar39 + (ulong)(uVar27 & uVar33) * 4 +
                        (ulong)(uVar46 << ((byte)uVar7 & 0x1f)) * 4) = (int)uVar37;
                *(ushort *)(pBVar9->size_bits_by_length + (ulong)uVar46 * 2) = uVar33 + 1;
                local_f8 = local_f8 + 2;
                uVar37 = uVar37 + 2;
              } while (uVar37 < uVar36);
            }
          }
        }
      }
      else {
        if (!bVar13) {
          pBVar9 = (params->dictionary).words;
          lVar39 = *(long *)&(params->dictionary).num_transforms;
          uVar37 = (lVar2 + num_bytes) - position;
          iVar26 = 0;
          local_e0 = local_118;
LAB_00104cef:
          uVar35 = uVar37 >> 3;
          local_158 = local_158 - 1;
          uVar36 = uVar21 - 1;
          if (local_158 <= uVar21 - 1) {
            uVar36 = local_158;
          }
          if (4 < *(int *)(literal_context_lut + 4)) {
            uVar36 = 0;
          }
          uVar48 = position + 1;
          uVar25 = uVar3;
          if (uVar48 < uVar3) {
            uVar25 = uVar48;
          }
          uVar22 = lVar8 + position + 1;
          if (uVar3 <= uVar22) {
            uVar22 = uVar3;
          }
          uVar53 = *(ulong *)(literal_context_lut + 0x50);
          uVar31 = uVar48 & ringbuffer_mask;
          psVar38 = *(size_t **)backward_references;
          bVar57 = psVar38 < back_refs_position;
          if (!bVar57) {
LAB_00104e67:
            uVar44 = (ulong)(int)(params->dist).alphabet_size_limit;
            if (uVar44 != 0) {
              puVar30 = ringbuffer + uVar31;
              uVar56 = (ulong)((uint)local_158 & 7);
              local_150 = 0x7e4;
              uVar49 = 0;
              local_120 = 0;
              local_118 = 0;
LAB_00104eb6:
              uVar40 = (ulong)*(int *)((long)&(hasher->common).extra + uVar49 * 4);
              if (((uVar40 <= uVar25) && (uVar48 - uVar40 < uVar48)) &&
                 (uVar36 + uVar31 <= ringbuffer_mask)) {
                uVar23 = uVar48 - uVar40 & ringbuffer_mask;
                if ((ringbuffer_mask < uVar23 + uVar36) ||
                   (ringbuffer[uVar36 + uVar31] != ringbuffer[uVar23 + uVar36])) goto LAB_00104feb;
                uVar45 = uVar56;
                if (7 < local_158) {
                  lVar42 = 0;
                  uVar43 = 0;
LAB_00104f25:
                  if (*(ulong *)(puVar30 + uVar43 * 8) ==
                      *(ulong *)(ringbuffer + uVar43 * 8 + uVar23)) goto code_r0x00104f37;
                  uVar45 = *(ulong *)(ringbuffer + uVar43 * 8 + uVar23) ^
                           *(ulong *)(puVar30 + uVar43 * 8);
                  uVar23 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                    }
                  }
                  uVar43 = (uVar23 >> 3 & 0x1fffffff) - lVar42;
                  goto LAB_00104f68;
                }
                uVar43 = 0;
                puVar51 = puVar30;
                goto joined_r0x00105003;
              }
              goto LAB_00104feb;
            }
            local_150 = 0x7e4;
            local_118 = 0;
            local_120 = 0;
LAB_00105045:
            uVar27 = (uint)(*(int *)(ringbuffer + uVar31) * 0x1e35a7bd) >>
                     ((byte)(params->dist).distance_postfix_bits & 0x1f);
            puVar30 = ringbuffer + uVar31;
            lVar42 = lVar39 + (ulong)(uVar27 << ((byte)(params->dist).alphabet_size_max & 0x1f)) * 4
            ;
            uVar33 = *(ushort *)(pBVar9->size_bits_by_length + (ulong)uVar27 * 2);
            uVar56 = (ulong)uVar33;
            piVar32 = &(params->hasher).num_last_distances_to_check;
            uVar44 = 0;
            if (*(ulong *)piVar32 <= uVar56) {
              uVar44 = uVar56 - *(long *)piVar32;
            }
            uVar49 = (ulong)((uint)local_158 & 7);
LAB_001050cd:
            if (uVar44 < uVar56) {
              uVar56 = uVar56 - 1;
              uVar46 = *(uint *)(lVar42 + (ulong)((params->dist).num_direct_distance_codes &
                                                 (uint)uVar56) * 4);
              uVar40 = uVar48 - uVar46;
              if ((uVar40 <= uVar25) && (uVar36 + uVar31 <= ringbuffer_mask)) {
                uVar23 = (ulong)(uVar46 & (uint)ringbuffer_mask);
                if ((ringbuffer_mask < uVar23 + uVar36) ||
                   (ringbuffer[uVar36 + uVar31] != ringbuffer[uVar23 + uVar36])) goto LAB_00105163;
                uVar45 = uVar49;
                if (7 < local_158) {
                  lVar41 = 0;
                  uVar43 = 0;
LAB_00105128:
                  if (*(ulong *)(puVar30 + uVar43 * 8) ==
                      *(ulong *)(ringbuffer + uVar43 * 8 + uVar23)) goto code_r0x0010513a;
                  uVar45 = *(ulong *)(ringbuffer + uVar43 * 8 + uVar23) ^
                           *(ulong *)(puVar30 + uVar43 * 8);
                  uVar23 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                    }
                  }
                  uVar43 = (uVar23 >> 3 & 0x1fffffff) - lVar41;
                  goto LAB_0010517f;
                }
                uVar43 = 0;
                puVar51 = puVar30;
                goto joined_r0x001051f4;
              }
              goto LAB_00105163;
            }
            goto LAB_0010520f;
          }
          if ((ulong)(long)(int)num_literals[(long)psVar38 * 2] < uVar48) {
            psVar34 = num_literals + (long)psVar38 * 2 + 2;
            do {
              psVar38 = (size_t *)((long)psVar38 + 1);
              if (back_refs_position == psVar38) {
                *(size_t **)backward_references = psVar38;
                bVar57 = false;
                psVar38 = back_refs_position;
                goto LAB_00104e67;
              }
              sVar12 = *psVar34;
              psVar34 = psVar34 + 2;
            } while ((ulong)(long)(int)sVar12 < uVar48);
            *(size_t **)backward_references = psVar38;
            bVar57 = psVar38 < back_refs_position;
          }
          if ((!bVar57) || (uVar48 != (long)(int)num_literals[(long)psVar38 * 2]))
          goto LAB_00104e67;
          uVar27 = (uint)num_literals[(long)psVar38 * 2 + 1];
          local_118 = (ulong)(int)uVar27;
          local_150 = 0x7e4;
          iVar14 = 0;
          bVar10 = true;
          if ((uVar48 - local_118 < uVar48) &&
             (uVar27 <= *(uint *)((long)num_literals + (long)psVar38 * 0x10 + 0xc))) {
            uVar36 = uVar48 - local_118 & ringbuffer_mask;
            puVar30 = ringbuffer + uVar31;
            if (7 < local_158) {
              lVar42 = 0;
              uVar44 = 0;
LAB_001056b5:
              if (*(ulong *)(puVar30 + uVar44 * 8) == *(ulong *)(ringbuffer + uVar44 * 8 + uVar36))
              goto code_r0x001056c2;
              uVar35 = *(ulong *)(ringbuffer + uVar44 * 8 + uVar36) ^
                       *(ulong *)(puVar30 + uVar44 * 8);
              uVar36 = 0;
              if (uVar35 != 0) {
                for (; (uVar35 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              uVar35 = (uVar36 >> 3 & 0x1fffffff) - lVar42;
              goto LAB_001056ee;
            }
            uVar35 = 0;
            goto LAB_00105783;
          }
          bVar13 = false;
          local_118 = 0;
          local_120 = 0;
          goto LAB_00105727;
        }
LAB_00104b75:
        uVar37 = position + lVar8;
        if (uVar3 <= position + lVar8) {
          uVar37 = uVar3;
        }
        if (uVar37 < local_118) {
LAB_0010588a:
          uVar36 = local_118 + 0xf;
        }
        else {
          uVar36 = (ulong)*(int *)&(hasher->common).extra;
          uVar27 = 0;
          bVar57 = false;
          if (local_118 != uVar36) {
            uVar35 = (ulong)*(int *)((long)&(hasher->common).extra + 4);
            if (local_118 == uVar35) {
              uVar27 = 1;
            }
            else {
              uVar36 = (local_118 + 3) - uVar36;
              if (uVar36 < 7) {
                bVar19 = (byte)((int)uVar36 << 2);
                uVar27 = 0x9750468;
              }
              else {
                uVar35 = (local_118 + 3) - uVar35;
                if (6 < uVar35) {
                  if (local_118 != (long)(int)(hasher->common).dict_num_lookups) {
                    bVar57 = local_118 !=
                             (long)*(int *)((long)&(hasher->common).dict_num_lookups + 4);
                    uVar27 = 3;
                    goto LAB_00105886;
                  }
                  uVar27 = 2;
                  goto LAB_00105884;
                }
                bVar19 = (byte)((int)uVar35 << 2);
                uVar27 = 0xfdb1ace;
              }
              uVar27 = uVar27 >> (bVar19 & 0x1f) & 0xf;
            }
LAB_00105884:
            bVar57 = false;
          }
LAB_00105886:
          if (bVar57) goto LAB_0010588a;
          uVar36 = (ulong)uVar27;
        }
        if ((local_118 <= uVar37) && (uVar36 != 0)) {
          (hasher->common).dict_num_lookups = *(size_t *)((long)&(hasher->common).extra + 4);
          iVar26 = *(int *)&(hasher->common).extra;
          *(int *)((long)&(hasher->common).extra + 4) = iVar26;
          iVar14 = (int)local_118;
          *(int *)&(hasher->common).extra = iVar14;
          uVar4 = (params->dist).alphabet_size_limit;
          if (4 < (int)uVar4) {
            *(int *)&(hasher->common).dict_num_matches = iVar14 + -1;
            *(int *)((long)&(hasher->common).dict_num_matches + 4) = iVar14 + 1;
            (hasher->common).params.type = iVar14 + -2;
            (hasher->common).params.bucket_bits = iVar14 + 2;
            (hasher->common).params.block_bits = iVar14 + -3;
            (hasher->common).params.hash_len = iVar14 + 3;
            if (10 < (int)uVar4) {
              (hasher->common).params.num_last_distances_to_check = iVar26 + -1;
              (hasher->common).is_prepared_ = iVar26 + 1;
              *(int *)&hasher->privat = iVar26 + -2;
              *(int *)((long)&hasher->privat + 4) = iVar26 + 2;
              *(int *)((long)&hasher->privat + 8) = iVar26 + -3;
              *(int *)((long)&hasher->privat + 0xc) = iVar26 + 3;
            }
          }
        }
        uVar27 = (uint)local_f8;
        *(uint *)local_b8 = uVar27;
        *(uint *)((long)local_b8 + 4) = iVar28 << 0x19 | (uint)uVar21;
        uVar37 = (ulong)*(uint *)(literal_context_lut + 0x44) + 0x10;
        if (uVar36 < uVar37) {
          *(short *)((long)local_b8 + 0xe) = (short)uVar36;
          uVar46 = 0;
        }
        else {
          bVar19 = (byte)*(int *)(literal_context_lut + 0x40);
          uVar36 = ((uVar36 - *(uint *)(literal_context_lut + 0x44)) + (4L << (bVar19 & 0x3f))) -
                   0x10;
          uVar46 = 0x1f;
          if ((uint)uVar36 != 0) {
            for (; (uint)uVar36 >> uVar46 == 0; uVar46 = uVar46 - 1) {
            }
          }
          uVar47 = (uVar46 ^ 0xffffffe0) + 0x1f;
          uVar46 = (uint)((uVar36 >> ((ulong)uVar47 & 0x3f) & 1) != 0);
          iVar26 = uVar47 - *(int *)(literal_context_lut + 0x40);
          *(ushort *)((long)local_b8 + 0xe) =
               (short)(uVar46 + iVar26 * 2 + 0xfffe << (bVar19 & 0x3f)) +
               (short)uVar37 + (~(ushort)(-1 << (bVar19 & 0x1f)) & (ushort)uVar36) |
               (short)iVar26 * 0x400;
          uVar46 = (uint)(uVar36 - ((ulong)uVar46 + 2 << ((byte)uVar47 & 0x3f)) >> (bVar19 & 0x3f));
        }
        *(uint *)(local_b8 + 1) = uVar46;
        if (5 < local_f8) {
          if (local_f8 < 0x82) {
            uVar27 = 0x1f;
            uVar46 = (uint)(local_f8 - 2);
            if (uVar46 != 0) {
              for (; uVar46 >> uVar27 == 0; uVar27 = uVar27 - 1) {
              }
            }
            uVar27 = (int)(local_f8 - 2 >> ((char)(uVar27 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar27 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_f8 < 0x842) {
            uVar46 = 0x1f;
            if (uVar27 - 0x42 != 0) {
              for (; uVar27 - 0x42 >> uVar46 == 0; uVar46 = uVar46 - 1) {
              }
            }
            uVar27 = (uVar46 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar27 = 0x15;
            if (0x1841 < local_f8) {
              uVar27 = (uint)(ushort)(0x17 - (local_f8 < 0x5842));
            }
          }
        }
        uVar46 = iVar28 + (uint)uVar21;
        if (uVar46 < 10) {
          uVar47 = uVar46 - 2;
        }
        else if (uVar46 < 0x86) {
          uVar46 = uVar46 - 6;
          uVar47 = 0x1f;
          if (uVar46 != 0) {
            for (; uVar46 >> uVar47 == 0; uVar47 = uVar47 - 1) {
            }
          }
          uVar47 = (int)((ulong)(long)(int)uVar46 >> ((char)(uVar47 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar47 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar47 = 0x17;
          if (uVar46 < 0x846) {
            uVar47 = 0x1f;
            if (uVar46 - 0x46 != 0) {
              for (; uVar46 - 0x46 >> uVar47 == 0; uVar47 = uVar47 - 1) {
              }
            }
            uVar47 = (uVar47 ^ 0xffe0) + 0x2c;
          }
        }
        uVar11 = (ushort)uVar47;
        uVar33 = (uVar11 & 7) + ((ushort)uVar27 & 7) * 8;
        if ((((*(ushort *)((long)local_b8 + 0xe) & 0x3ff) == 0) && ((ushort)uVar27 < 8)) &&
           (uVar11 < 0x10)) {
          if (7 < uVar11) {
            uVar33 = uVar33 | 0x40;
          }
        }
        else {
          iVar28 = ((uVar27 & 0xffff) >> 3) * 3 + ((uVar47 & 0xffff) >> 3);
          uVar33 = uVar33 + ((ushort)(0x520d40 >> ((char)iVar28 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar28 * 0x40 + 0x40;
        }
        *(ushort *)((long)local_b8 + 0xc) = uVar33;
        *num_commands = *num_commands + local_f8;
        uVar37 = position + uVar21;
        uVar36 = uVar15;
        if (uVar37 < uVar15) {
          uVar36 = uVar37;
        }
        uVar35 = position + 2;
        if (local_118 < uVar21 >> 2) {
          uVar48 = uVar37 + local_118 * -4;
          if (uVar48 < uVar35) {
            uVar48 = uVar35;
          }
          uVar35 = uVar48;
          if (uVar36 < uVar48) {
            uVar35 = uVar36;
          }
        }
        local_d8 = lVar20 + uVar21 * 2 + position;
        local_b8 = local_b8 + 2;
        if (uVar35 < uVar36) {
          uVar4 = (params->dist).distance_postfix_bits;
          uVar27 = (params->dist).num_direct_distance_codes;
          pBVar9 = (params->dictionary).words;
          uVar7 = (params->dist).alphabet_size_max;
          lVar39 = *(long *)&(params->dictionary).num_transforms;
          do {
            uVar46 = (uint)(*(int *)(ringbuffer + (uVar35 & ringbuffer_mask)) * 0x1e35a7bd) >>
                     ((byte)uVar4 & 0x1f);
            uVar33 = *(ushort *)(pBVar9->size_bits_by_length + (ulong)uVar46 * 2);
            *(int *)(lVar39 + (ulong)(uVar27 & uVar33) * 4 +
                    (ulong)(uVar46 << ((byte)uVar7 & 0x1f)) * 4) = (int)uVar35;
            *(ushort *)(pBVar9->size_bits_by_length + (ulong)uVar46 * 2) = uVar33 + 1;
            uVar35 = uVar35 + 1;
          } while (uVar36 != uVar35);
          local_f8 = 0;
        }
        else {
          local_f8 = 0;
        }
      }
      position = uVar37;
    } while (position + 4 < uVar1);
  }
  else {
    local_b8 = last_insert_len;
  }
  *(ulong *)dist_cache = (local_f8 + uVar1) - position;
  *(long *)commands = *(long *)commands + ((long)local_b8 - (long)last_insert_len >> 4);
  return;
code_r0x00104379:
  uVar56 = uVar56 + 1;
  lVar42 = lVar42 + -8;
  uVar49 = local_158 & 0xfffffffffffffff8;
  puVar51 = puVar30 + (local_158 & 0xfffffffffffffff8);
  if (local_158 >> 3 == uVar56) goto LAB_00104466;
  goto LAB_00104364;
code_r0x001045db:
  uVar56 = uVar56 + 1;
  lVar42 = lVar42 + -8;
  puVar51 = puVar30 + (local_158 & 0xfffffffffffffff8);
  uVar49 = local_158 & 0xfffffffffffffff8;
  if (local_158 >> 3 == uVar56) goto LAB_0010469a;
  goto LAB_001045c9;
code_r0x00104acb:
  uVar22 = uVar22 + 1;
  lVar39 = lVar39 + -8;
  if (local_158 >> 3 == uVar22) goto LAB_00105c88;
  goto LAB_00104abe;
code_r0x0010492b:
  uVar25 = uVar25 + 1;
  lVar52 = lVar52 + -8;
  if (bVar19 >> 3 == uVar25) goto code_r0x00104937;
  goto LAB_0010491e;
code_r0x00104937:
  pcVar24 = pcVar24 + -lVar52;
LAB_00104a39:
  uVar53 = uVar48 & 7;
  uVar25 = uVar22;
  if ((bVar19 & 7) != 0) {
    uVar31 = uVar22 | uVar53;
    do {
      uVar25 = uVar22;
      if (*(char *)((long)piVar32 + uVar22) != *pcVar24) break;
      pcVar24 = pcVar24 + 1;
      uVar22 = uVar22 + 1;
      uVar53 = uVar53 - 1;
      uVar25 = uVar31;
    } while (uVar53 != 0);
  }
LAB_00104969:
  bVar57 = true;
  if (((uVar25 != 0) && (uVar48 < *(uint *)(literal_context_lut + 100) + uVar25)) &&
     (uVar48 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar48 - uVar25) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar48 - uVar25) * 4 << (*(byte *)(lVar29 + uVar48) & 0x3f)) + uVar21 + uVar36 + 1,
     uVar48 <= uVar35)) {
    iVar26 = 0x1f;
    if ((uint)uVar48 != 0) {
      for (; (uint)uVar48 >> iVar26 == 0; iVar26 = iVar26 + -1) {
      }
    }
    uVar21 = (uVar25 * 0x87 - (ulong)(uint)(iVar26 * 0x1e)) + 0x780;
    if (local_110 <= uVar21) {
      iVar28 = (uint)bVar19 - (int)uVar25;
      bVar57 = false;
      local_150 = uVar25;
      local_118 = uVar48;
      local_110 = uVar21;
    }
  }
LAB_001049c2:
  if (!bVar57) {
    *(long *)(sVar12 + 0x10) = *(long *)(sVar12 + 0x10) + 1;
  }
LAB_001049d0:
  uVar37 = uVar37 + 1;
  bVar57 = lVar41 != 0;
  lVar41 = lVar41 + 1;
  uVar21 = local_150;
  if (bVar57) goto LAB_00104b4a;
  goto LAB_001048b2;
code_r0x00104f37:
  uVar43 = uVar43 + 1;
  lVar42 = lVar42 + -8;
  if (uVar35 == uVar43) goto code_r0x00104f48;
  goto LAB_00104f25;
code_r0x00104f48:
  uVar43 = -lVar42;
  puVar51 = puVar30 + -lVar42;
joined_r0x00105003:
  for (; (uVar45 != 0 && (ringbuffer[uVar43 + uVar23] == *puVar51)); uVar43 = uVar43 + 1) {
    uVar45 = uVar45 - 1;
    puVar51 = puVar51 + 1;
  }
LAB_00104f68:
  if ((bVar57) && ((ulong)(long)(int)num_literals[(long)psVar38 * 2] < uVar43 + uVar48)) {
    uVar43 = (long)(int)num_literals[(long)psVar38 * 2] - uVar48;
  }
  if (((2 < uVar43) || ((uVar49 < 2 && (uVar43 == 2)))) &&
     (uVar23 = uVar43 * 0x87 + 0x78f, local_150 < uVar23)) {
    if (uVar49 != 0) {
      uVar23 = uVar23 - ((0x1ca10U >> ((byte)uVar49 & 0xe) & 0xe) + 0x27);
    }
    if (local_150 < uVar23) {
      uVar36 = uVar43;
      local_150 = uVar23;
      local_120 = uVar43;
      local_118 = uVar40;
    }
  }
LAB_00104feb:
  uVar49 = uVar49 + 1;
  if (uVar49 == uVar44) goto LAB_00105045;
  goto LAB_00104eb6;
code_r0x0010513a:
  uVar43 = uVar43 + 1;
  lVar41 = lVar41 + -8;
  if (uVar35 == uVar43) goto code_r0x0010514b;
  goto LAB_00105128;
code_r0x0010514b:
  uVar43 = -lVar41;
  puVar51 = puVar30 + -lVar41;
joined_r0x001051f4:
  for (; (uVar45 != 0 && (ringbuffer[uVar43 + uVar23] == *puVar51)); uVar43 = uVar43 + 1) {
    uVar45 = uVar45 - 1;
    puVar51 = puVar51 + 1;
  }
LAB_0010517f:
  if ((bVar57) && ((ulong)(long)(int)num_literals[(long)psVar38 * 2] < uVar43 + uVar48)) {
    uVar43 = (long)(int)num_literals[(long)psVar38 * 2] - uVar48;
  }
  if (3 < uVar43) {
    iVar14 = 0x1f;
    if ((uint)uVar40 != 0) {
      for (; (uint)uVar40 >> iVar14 == 0; iVar14 = iVar14 + -1) {
      }
    }
    uVar23 = (ulong)(iVar14 * -0x1e + 0x780) + uVar43 * 0x87;
    if (local_150 < uVar23) {
      uVar36 = uVar43;
      local_150 = uVar23;
      local_120 = uVar43;
      local_118 = uVar40;
    }
  }
LAB_00105163:
  if (uVar25 < uVar40) goto LAB_0010520f;
  goto LAB_001050cd;
LAB_0010520f:
  *(int *)(lVar42 + (ulong)((params->dist).num_direct_distance_codes & (uint)uVar33) * 4) =
       (int)uVar48;
  *(ushort *)(pBVar9->size_bits_by_length + (ulong)uVar27 * 2) = uVar33 + 1;
  bVar13 = false;
  goto LAB_00105241;
code_r0x001056c2:
  uVar44 = uVar44 + 1;
  lVar42 = lVar42 + -8;
  if (uVar35 == uVar44) goto code_r0x001056d3;
  goto LAB_001056b5;
code_r0x001056d3:
  puVar30 = puVar30 + -lVar42;
  uVar35 = -lVar42;
LAB_00105783:
  uVar44 = local_158 & 7;
  for (; (uVar44 != 0 && (ringbuffer[uVar35 + uVar36] == *puVar30)); uVar35 = uVar35 + 1) {
    puVar30 = puVar30 + 1;
    uVar44 = uVar44 - 1;
  }
LAB_001056ee:
  local_120 = (ulong)*(int *)((long)num_literals + (long)psVar38 * 0x10 + 4);
  if (uVar35 < local_120) {
    local_120 = uVar35;
  }
  iVar50 = 0x1f;
  if (uVar27 != 0) {
    for (; uVar27 >> iVar50 == 0; iVar50 = iVar50 + -1) {
    }
  }
  local_150 = (ulong)(iVar50 * -0x1e + 0x780) + local_120 * 0x87;
  bVar13 = true;
  bVar10 = false;
LAB_00105727:
  if (!bVar10) goto LAB_001053a8;
LAB_00105241:
  iVar14 = 0;
  if (local_150 == 0x7e4) {
    if (back_refs_position == (size_t *)0x0) {
      sVar12 = (params->dist).max_distance;
      if (*(ulong *)(sVar12 + 8) >> 7 <= *(ulong *)(sVar12 + 0x10)) {
        piVar32 = (int *)(ringbuffer + uVar31);
        uVar36 = (ulong)((uint)(*piVar32 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        lVar42 = *(long *)(literal_context_lut + 0x78);
        lVar41 = *(long *)(sVar12 + 8);
        iVar14 = 0;
        lVar29 = 0;
LAB_001054ab:
        lVar41 = lVar41 + 1;
        *(long *)(sVar12 + 8) = lVar41;
        bVar19 = *(byte *)(lVar42 + uVar36);
        uVar35 = (ulong)bVar19;
        if (uVar35 != 0) {
          bVar57 = true;
          if (uVar35 <= local_158) {
            uVar25 = (ulong)*(ushort *)(*(long *)(literal_context_lut + 0x70) + uVar36 * 2);
            lVar52 = *(long *)(literal_context_lut + 0x58);
            pcVar24 = (char *)(uVar25 * uVar35 + *(long *)(lVar52 + 0xa8) +
                              (ulong)*(uint *)(lVar52 + 0x20 + uVar35 * 4));
            if (7 < bVar19) {
              uVar44 = (ulong)(bVar19 & 0xfffffff8);
              lVar55 = 0;
              uVar31 = 0;
LAB_00105523:
              if (*(ulong *)(pcVar24 + uVar31 * 8) == *(ulong *)(piVar32 + uVar31 * 2))
              goto code_r0x00105531;
              uVar44 = *(ulong *)(piVar32 + uVar31 * 2) ^ *(ulong *)(pcVar24 + uVar31 * 8);
              uVar31 = 0;
              if (uVar44 != 0) {
                for (; (uVar44 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                }
              }
              uVar31 = (uVar31 >> 3 & 0x1fffffff) - lVar55;
              goto LAB_0010556d;
            }
            uVar44 = 0;
            goto LAB_00105646;
          }
          goto LAB_001055d9;
        }
        goto LAB_001055e1;
      }
    }
    else if ((bVar57) && (uVar48 == (long)(int)num_literals[(long)psVar38 * 2])) {
      uVar27 = (uint)num_literals[(long)psVar38 * 2 + 1];
      if (*(int *)((long)num_literals + (long)psVar38 * 0x10 + 0xc) < (int)uVar27) {
        uVar46 = *(uint *)((long)num_literals + (long)psVar38 * 0x10 + 4);
        uVar36 = (ulong)uVar46;
        bVar13 = true;
        if (uVar46 - 4 < 0x15 && (int)uVar27 < 0x7ffffffd) {
          uVar47 = ~(uint)uVar25 + uVar27;
          lVar42 = *(long *)(literal_context_lut + 0x58);
          iVar50 = (int)uVar47 >> (*(byte *)(lVar42 + uVar36) & 0x1f);
          if (iVar50 < *(int *)(literal_context_lut + 0x60)) {
            uVar5 = *(uint *)(lVar42 + 0x20 + uVar36 * 4);
            uVar6 = kBitMask[*(byte *)(lVar42 + uVar36)];
            lVar42 = *(long *)(lVar42 + 0xa8);
            uVar17 = BrotliGetTransforms();
            pvVar18 = malloc(uVar36 * 10);
            iVar14 = BrotliTransformDictionaryWord
                               (pvVar18,(ulong)uVar5 + lVar42 +
                                        (long)(int)((uVar47 & uVar6) * uVar46),uVar36,uVar17,iVar50)
            ;
            sVar54 = (size_t)iVar14;
            iVar50 = bcmp(ringbuffer + uVar31,pvVar18,sVar54);
            if (iVar50 == 0) {
              iVar50 = 0x1f;
              if (uVar27 != 0) {
                for (; uVar27 >> iVar50 == 0; iVar50 = iVar50 + -1) {
                }
              }
              local_150 = (ulong)(iVar50 * -0x1e + 0x780) + sVar54 * 0x87;
              iVar14 = uVar46 - iVar14;
              local_120 = sVar54;
              local_118 = (long)(int)uVar27;
            }
            else {
              iVar14 = 0;
            }
          }
          bVar13 = true;
        }
      }
    }
  }
LAB_001053a8:
  bVar57 = true;
  if ((bVar13) || (local_110 + 0xaf <= local_150)) {
    local_f8 = local_f8 + 1;
    bVar57 = (2 < iVar26 || bVar13) || uVar1 <= position + 5;
    local_110 = local_150;
    uVar21 = local_120;
    position = uVar48;
    local_e0 = local_118;
    iVar28 = iVar14;
    iVar26 = iVar26 + 1;
  }
  uVar37 = uVar37 - 1;
  local_118 = local_e0;
  if (bVar57) goto LAB_00104b75;
  goto LAB_00104cef;
code_r0x00105531:
  uVar31 = uVar31 + 1;
  lVar55 = lVar55 + -8;
  if (bVar19 >> 3 == uVar31) goto code_r0x0010553d;
  goto LAB_00105523;
code_r0x0010553d:
  pcVar24 = pcVar24 + -lVar55;
LAB_00105646:
  uVar56 = uVar35 & 7;
  uVar31 = uVar44;
  if ((bVar19 & 7) != 0) {
    uVar49 = uVar44 | uVar56;
    do {
      uVar31 = uVar44;
      if (*(char *)((long)piVar32 + uVar44) != *pcVar24) break;
      pcVar24 = pcVar24 + 1;
      uVar44 = uVar44 + 1;
      uVar56 = uVar56 - 1;
      uVar31 = uVar49;
    } while (uVar56 != 0);
  }
LAB_0010556d:
  if (((uVar31 == 0) || (*(uint *)(literal_context_lut + 100) + uVar31 <= uVar35)) ||
     (uVar35 = ((ulong)((uint)(*(ulong *)(literal_context_lut + 0x68) >>
                              ((char)(uVar35 - uVar31) * '\x06' & 0x3fU)) & 0x3f) +
                (uVar35 - uVar31) * 4 << (*(byte *)(lVar52 + uVar35) & 0x3f)) + uVar25 + uVar22 + 1,
     uVar53 < uVar35)) {
    bVar57 = true;
  }
  else {
    iVar50 = 0x1f;
    if ((uint)uVar35 != 0) {
      for (; (uint)uVar35 >> iVar50 == 0; iVar50 = iVar50 + -1) {
      }
    }
    uVar25 = (uVar31 * 0x87 - (ulong)(uint)(iVar50 * 0x1e)) + 0x780;
    bVar57 = true;
    if (local_150 <= uVar25) {
      iVar14 = (uint)bVar19 - (int)uVar31;
      bVar57 = false;
      local_150 = uVar25;
      local_120 = uVar31;
      local_118 = uVar35;
    }
  }
LAB_001055d9:
  if (!bVar57) {
    *(long *)(sVar12 + 0x10) = *(long *)(sVar12 + 0x10) + 1;
  }
LAB_001055e1:
  uVar36 = uVar36 + 1;
  bVar57 = lVar29 != 0;
  lVar29 = lVar29 + 1;
  if (bVar57) goto LAB_001053a8;
  goto LAB_001054ab;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals,
    const BackwardReferenceFromDecoder* backward_references,
    size_t* back_refs_position, size_t back_refs_size) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  BROTLI_UNUSED(literal_context_lut);

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    sr.used_stored = BROTLI_FALSE;
    FN(FindLongestMatch)(privat, &params->dictionary,
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance,
        backward_references, back_refs_position, back_refs_size, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      /* If a reference from backward_references array was found
         then just take it */
      if (!sr.used_stored) {
          for (;; --max_length) {
            const score_t cost_diff_lazy = 175;
            HasherSearchResult sr2;
            sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
                BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
            sr2.len_code_delta = 0;
            sr2.distance = 0;
            sr2.score = kMinScore;
            sr2.used_stored = BROTLI_FALSE;
            max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
            dictionary_start = BROTLI_MIN(size_t,
                position + 1 + position_offset, max_backward_limit);
            FN(FindLongestMatch)(privat,
                &params->dictionary,
                ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
                max_distance, dictionary_start + gap, params->dist.max_distance,
                backward_references, back_refs_position, back_refs_size, &sr2);
            if (sr2.score >= sr.score + cost_diff_lazy || sr2.used_stored) {
              /* Ok, let's just write one byte for now and start a match from the
                 next byte. */
              ++position;
              ++insert_length;
              sr = sr2;
              /* If a reference from backward_references array was found
                 then just take it */
              if (sr2.used_stored) {
                ++delayed_backward_references_in_row;
                break;
              }
              if (++delayed_backward_references_in_row < 4 &&
                  position + FN(HashTypeLength)() < pos_end) {
                continue;
              }
            }
            break;
          }
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics && back_refs_size == 0) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}